

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::prepareExpandedExpression(AssertionResult *result)

{
  string sStack_28;
  
  AssertionResult::getExpandedExpression_abi_cxx11_(&sStack_28,result);
  std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void prepareExpandedExpression(AssertionResult& result) {
        result.getExpandedExpression();
    }